

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::
concat<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,Repeat<char> *params,
          ArrayPtr<const_char> *params_1,FixedArray<char,_1UL> *params_2,
          CappedArray<char,_14UL> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5)

{
  long lVar1;
  size_t size;
  char *target;
  long local_60 [6];
  
  local_60[0] = *(long *)(this + 8);
  local_60[1] = params->count;
  local_60[2] = 1;
  local_60[3] = *(undefined8 *)params_2;
  local_60[4] = *(undefined8 *)params_3->content;
  local_60[5] = params_4->size_;
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_60 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x30);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (target,(Repeat<char> *)this,(ArrayPtr<const_char> *)params,
             (FixedArray<char,_1UL> *)params_1,(CappedArray<char,_14UL> *)params_2,
             (ArrayPtr<const_char> *)params_3,params_4);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}